

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.cxx
# Opt level: O0

void xray_re::initialize(void)

{
  double dVar1;
  uint local_14;
  int local_10;
  int v;
  int u;
  int i;
  
  v = 0x2000;
  while (v = v - 1, -1 < v) {
    local_10 = v >> 7;
    local_14 = v & 0x7f;
    if (0x7e < (int)(local_10 + local_14)) {
      local_10 = 0x7f - local_10;
      local_14 = 0x7f - local_14;
    }
    dVar1 = std::sqrt((double)(ulong)(uint)(((126.0 - (float)local_10) - (float)(int)local_14) *
                                            ((126.0 - (float)local_10) - (float)(int)local_14) +
                                           (float)(int)(local_10 * local_10 + local_14 * local_14)))
    ;
    *(float *)(uv_adjustment + (long)v * 4) = 1.0 / SUB84(dVar1,0);
  }
  initialized = 1;
  return;
}

Assistant:

void initialize()
{
//	for (int i = 0; i != xr_dim(uv_adjustment); ++i) {
	for (int i = xr_dim(uv_adjustment); --i >= 0;) {
		int u = i >> 7;
		int v = i & 0x7f;
		if (u + v >= 127) {
			u = 127 - u;
			v = 127 - v;
		}
		uv_adjustment[i] = 1.f/std::sqrt(u*u + v*v + (126.f-u-v)*(126.f-u-v));
	}
	initialized = true;
}